

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  void *__src;
  undefined8 *puVar11;
  ulong uVar12;
  uchar *a;
  uchar tmp [64];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (1 < count) {
    uVar12 = count >> 1;
    do {
      uVar12 = uVar12 - 1;
      secp256k1_heap_down((uchar *)ptr,uVar12,count,size,cmp,cmp_data);
    } while (uVar12 != 0);
  }
  if (1 < count) {
    puVar11 = (undefined8 *)((long)ptr + size * count + -0x40);
    do {
      puVar9 = puVar11;
      uVar10 = size;
      uVar12 = size;
      if (0x40 < size) {
        do {
          uVar12 = uVar10 - 0x40;
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x40));
          local_78 = *puVar1;
          uStack_70 = puVar1[1];
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x30));
          local_68 = *puVar1;
          uStack_60 = puVar1[1];
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x20));
          local_58 = *puVar1;
          uStack_50 = puVar1[1];
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x10));
          local_48 = *puVar1;
          uStack_40 = puVar1[1];
          uVar2 = puVar9[1];
          uVar3 = puVar9[2];
          uVar4 = puVar9[3];
          uVar5 = puVar9[4];
          uVar6 = puVar9[5];
          uVar7 = puVar9[6];
          uVar8 = puVar9[7];
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x40));
          *puVar1 = *puVar9;
          puVar1[1] = uVar2;
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x10));
          *puVar1 = uVar7;
          puVar1[1] = uVar8;
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x20));
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          puVar1 = (undefined8 *)((long)ptr + (uVar10 - 0x30));
          *puVar1 = uVar3;
          puVar1[1] = uVar4;
          puVar9[6] = local_48;
          puVar9[7] = uStack_40;
          puVar9[4] = local_58;
          puVar9[5] = uStack_50;
          puVar9[2] = local_68;
          puVar9[3] = uStack_60;
          *puVar9 = local_78;
          puVar9[1] = uStack_70;
          puVar9 = puVar9 + -8;
          uVar10 = uVar12;
        } while (0x40 < uVar12);
      }
      count = count - 1;
      __src = (void *)(count * size + (long)ptr);
      memcpy(&local_78,ptr,uVar12);
      memmove(ptr,__src,uVar12);
      memcpy(__src,&local_78,uVar12);
      secp256k1_heap_down((uchar *)ptr,0,count,size,cmp,cmp_data);
      puVar11 = (undefined8 *)((long)puVar11 - size);
    } while (1 < count);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data) {
    size_t i;

    for (i = count/2; 0 < i; --i) {
        secp256k1_heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for (i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        secp256k1_heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        secp256k1_heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}